

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yang_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  byte bVar1;
  long lVar2;
  char *__s;
  long lVar3;
  lys_node *__s_00;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  char *pcVar10;
  lys_node *plVar11;
  char *pcVar12;
  lys_node *plVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  LYS_NODE LVar19;
  int local_4c;
  uint uStack_48;
  int flag_1;
  lys_node *local_40;
  int local_34 [2];
  int flag;
  
  uVar18 = (ulong)(uint)level;
  local_40 = node;
  if ((node->nodetype & mask) == LYS_UNKNOWN) goto LAB_0018813c;
  if (((node->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) && ((node->flags & 0x40) != 0)) {
    return;
  }
  plVar13 = node->parent;
  if (plVar13 == (lys_node *)0x0) {
LAB_00188127:
    ly_print(out,"\n");
  }
  else if (plVar13->nodetype == LYS_AUGMENT) {
    if (plVar13->child != node) goto LAB_00188127;
  }
  else if (node->prev->next != (lys_node *)0x0) goto LAB_00188127;
LAB_0018813c:
  plVar13 = local_40;
  LVar19 = mask & local_40->nodetype;
  if (0xff < (int)LVar19) {
    if ((int)LVar19 < 0x800) {
      if (LVar19 != LYS_RPC) {
        if ((LVar19 != LYS_INPUT) && (LVar19 != LYS_OUTPUT)) {
          return;
        }
        ly_print(out,"%*s%s {\n",(ulong)(uint)(level * 2),"");
        iVar5 = level + 1;
        if (local_40->ext_size != 0) {
          yang_print_extension_instances
                    (out,iVar5,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                     (uint)local_40->ext_size);
        }
        if (local_40->padding[1] != '\0') {
          lVar14 = 0;
          uVar18 = 0;
          do {
            yang_print_must(out,iVar5,local_40->module,(lys_restr *)(local_40[1].name + lVar14));
            uVar18 = uVar18 + 1;
            lVar14 = lVar14 + 0x38;
          } while (uVar18 < local_40->padding[1]);
        }
        if (*(short *)(local_40->padding + 2) != 0) {
          lVar14 = 0;
          uVar18 = 0;
          do {
            yang_print_typedef(out,iVar5,local_40->module,
                               (lys_tpdf *)(*(long *)local_40->hash + lVar14));
            uVar18 = uVar18 + 1;
            lVar14 = lVar14 + 0x80;
          } while (uVar18 < *(ushort *)(local_40->padding + 2));
        }
        plVar11 = local_40;
        for (plVar13 = local_40->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
          if (plVar13->parent == plVar11) {
            yang_print_snode(out,iVar5,plVar13,0x800);
            plVar11 = local_40;
          }
        }
        for (plVar13 = plVar11->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
          if (plVar13->parent == plVar11) {
            yang_print_snode(out,iVar5,plVar13,0x903f);
            plVar11 = local_40;
          }
        }
        uVar18 = (ulong)(uint)(level * 2);
        goto LAB_0018a1e8;
      }
    }
    else {
      if ((int)LVar19 < 0x4000) {
        if (LVar19 == LYS_GROUPING) {
          local_34[0] = 0;
          _uStack_48 = uVar18;
          ly_print(out,"%*sgrouping %s",(ulong)(uint)(level * 2),"",local_40->name);
          iVar5 = level + 1;
          yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,0x71);
          if (*(short *)(local_40->padding + 2) != 0) {
            lVar14 = 0;
            uVar18 = 0;
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_typedef(out,iVar5,local_40->module,
                                 (lys_tpdf *)(*(long *)local_40->hash + lVar14));
              uVar18 = uVar18 + 1;
              lVar14 = lVar14 + 0x80;
            } while (uVar18 < *(ushort *)(local_40->padding + 2));
          }
          for (plVar13 = local_40->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar5,plVar13,0x800);
          }
          for (plVar13 = local_40->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar5,plVar13,0x903f);
          }
          for (plVar13 = local_40->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar5,plVar13,0x4000);
          }
          for (plVar13 = local_40->child; iVar7 = local_34[0], plVar13 != (lys_node *)0x0;
              plVar13 = plVar13->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar5,plVar13,0x80);
          }
        }
        else {
          if (LVar19 != LYS_USES) {
            return;
          }
          local_4c = 0;
          _uStack_48 = uVar18;
          ly_print(out,"%*suses ",(ulong)(uint)(level * 2),"");
          if (local_40->child != (lys_node *)0x0) {
            plVar8 = lys_node_module(local_40->child);
            plVar9 = lys_node_module(local_40);
            if (plVar9 != plVar8) {
              pcVar15 = transform_module_name2import_prefix(local_40->module,plVar8->name);
              ly_print(out,"%s:",pcVar15);
            }
          }
          ly_print(out,"%s",local_40->name);
          iVar5 = level + 1;
          yang_print_snode_common(out,iVar5,local_40,local_40->module,&local_4c,1);
          lVar14._0_1_ = local_40->hash[0];
          lVar14._1_1_ = local_40->hash[1];
          lVar14._2_1_ = local_40->hash[2];
          lVar14._3_1_ = local_40->hash[3];
          lVar14._4_4_ = *(undefined4 *)&local_40->field_0x6c;
          if (lVar14 != 0) {
            if (local_4c == 0) {
              local_4c = 1;
              ly_print(out," {\n");
            }
            yang_print_when(out,iVar5,local_40->module,*(lys_when **)local_40->hash);
          }
          yang_print_snode_common(out,iVar5,local_40,local_40->module,&local_4c,0x72);
          if (local_40->padding[2] != '\0') {
            iVar7 = (int)_uStack_48 + 2;
            uVar18 = 0;
            do {
              if (local_4c == 0) {
                local_4c = 1;
                ly_print(out," {\n");
              }
              plVar8 = local_40->module;
              pcVar15 = local_40[1].name;
              lVar14 = uVar18 * 0x50;
              plVar13 = (lys_node *)(pcVar15 + lVar14);
              local_34[0] = 0;
              pcVar10 = transform_json2schema(plVar8,*(char **)(pcVar15 + lVar14));
              ly_print(out,"%*srefine \"%s\"",(ulong)(uint)(iVar5 * 2),"",pcVar10);
              lydict_remove(plVar8->ctx,pcVar10);
              yang_print_snode_common(out,iVar7,plVar13,plVar8,local_34,3);
              if (pcVar15[lVar14 + 0x1e] != '\0') {
                lVar14 = 0;
                uVar17 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_must(out,iVar7,plVar8,
                                  (lys_restr *)(*(long *)&plVar13->nodetype + lVar14));
                  uVar17 = uVar17 + 1;
                  lVar14 = lVar14 + 0x38;
                } while (uVar17 < plVar13->padding[2]);
              }
              if (*(short *)plVar13->padding == 1) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_substmt(out,iVar7,LYEXT_SUBSTMT_PRESENCE,'\0',(char *)plVar13->child,
                                   plVar8,plVar13->ext,(uint)plVar13->ext_size);
              }
              if (plVar13->padding[3] != '\0') {
                uVar17 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_substmt(out,iVar7,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar17,
                                     *(char **)(plVar13->parent->padding + uVar17 * 8 + -0x1c),
                                     plVar8,plVar13->ext,(uint)plVar13->ext_size);
                  uVar17 = uVar17 + 1;
                } while (uVar17 < plVar13->padding[3]);
              }
              if ((plVar13->flags & 1) == 0) {
                if ((plVar13->flags & 2) != 0) {
                  pcVar15 = "false";
                  goto joined_r0x0018882d;
                }
              }
              else {
                pcVar15 = "true";
joined_r0x0018882d:
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_substmt(out,iVar7,LYEXT_SUBSTMT_CONFIG,'\0',pcVar15,plVar8,plVar13->ext,
                                   (uint)plVar13->ext_size);
              }
              if ((plVar13->flags & 0x40) == 0) {
                if ((char)plVar13->flags < '\0') {
                  pcVar15 = "false";
                  goto joined_r0x00188897;
                }
              }
              else {
                pcVar15 = "true";
joined_r0x00188897:
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_substmt(out,iVar7,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar15,plVar8,
                                   plVar13->ext,(uint)plVar13->ext_size);
              }
              if ((plVar13->padding[0] & 0x18) != 0) {
                if ((plVar13->flags & 0x10) != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_unsigned(out,iVar7,LYEXT_SUBSTMT_MIN,'\0',plVar8,plVar13->ext,
                                      (uint)plVar13->ext_size,*(uint *)&plVar13->child);
                }
                if ((plVar13->flags & 8) != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  uVar16 = *(uint *)((long)&plVar13->child + 4);
                  if (uVar16 == 0) {
                    yang_print_substmt(out,iVar7,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar8,
                                       plVar13->ext,(uint)plVar13->ext_size);
                  }
                  else {
                    yang_print_unsigned(out,iVar7,LYEXT_SUBSTMT_MAX,'\0',plVar8,plVar13->ext,
                                        (uint)plVar13->ext_size,uVar16);
                  }
                }
              }
              yang_print_snode_common(out,iVar7,plVar13,plVar8,local_34,0x60);
              yang_print_close(out,iVar5,local_34[0]);
              uVar18 = uVar18 + 1;
            } while (uVar18 < local_40->padding[2]);
          }
          iVar7 = local_4c;
          if (local_40->padding[3] != '\0') {
            lVar14 = 0;
            uVar18 = 0;
            do {
              if (local_4c == 0) {
                local_4c = 1;
                ly_print(out," {\n");
              }
              yang_print_augment(out,iVar5,(lys_node_augment *)(local_40[1].dsc + lVar14));
              uVar18 = uVar18 + 1;
              lVar14 = lVar14 + 0x68;
              iVar7 = local_4c;
            } while (uVar18 < local_40->padding[3]);
          }
        }
        goto LAB_0018a0d3;
      }
      if (LVar19 != LYS_ACTION) {
        if (LVar19 != LYS_ANYDATA) {
          return;
        }
        goto LAB_00188bb7;
      }
    }
    local_34[0] = 0;
    pcVar15 = "action";
    if (local_40->nodetype == LYS_RPC) {
      pcVar15 = "rpc";
    }
    ly_print(out,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar15,local_40->name);
    iVar5 = level + 1;
    _uStack_48 = uVar18;
    yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,0x73);
    if (*(short *)(local_40->padding + 2) != 0) {
      lVar14 = 0;
      uVar18 = 0;
      do {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_typedef(out,iVar5,local_40->module,(lys_tpdf *)(local_40[1].name + lVar14));
        uVar18 = uVar18 + 1;
        lVar14 = lVar14 + 0x80;
      } while (uVar18 < *(ushort *)(local_40->padding + 2));
    }
    plVar11 = local_40;
    iVar7 = local_34[0];
    for (plVar13 = local_40->child; local_34[0] = iVar7, plVar13 != (lys_node *)0x0;
        plVar13 = plVar13->next) {
      if ((plVar13->parent == plVar11) &&
         (((plVar13->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
          ((plVar13->flags & 0x40) == 0)))) {
        if (iVar7 == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_snode(out,iVar5,plVar13,0xe00);
        plVar11 = local_40;
      }
      iVar7 = local_34[0];
    }
    goto LAB_0018a0d3;
  }
  if ((int)LVar19 < 0x10) {
    switch(LVar19) {
    case LYS_CONTAINER:
      local_34[0] = 0;
      ly_print(out,"%*scontainer %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar5 = level + 1;
      _uStack_48 = uVar18;
      yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,1);
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_when(out,iVar5,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_iffeature
                    (out,iVar5,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x20;
        } while (uVar18 < local_40->iffeature_size);
      }
      if (local_40->padding[1] != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_must(out,iVar5,local_40->module,(lys_restr *)(local_40[1].dsc + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x38;
        } while (uVar18 < local_40->padding[1]);
      }
      lVar2._0_2_ = local_40[1].flags;
      lVar2._2_1_ = local_40[1].ext_size;
      lVar2._3_1_ = local_40[1].iffeature_size;
      lVar2._4_1_ = local_40[1].padding[0];
      lVar2._5_1_ = local_40[1].padding[1];
      lVar2._6_1_ = local_40[1].padding[2];
      lVar2._7_1_ = local_40[1].padding[3];
      if (lVar2 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_PRESENCE,'\0',*(char **)&local_40[1].flags,
                           local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,0x74);
      if (*(short *)(local_40->padding + 2) != 0) {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_typedef(out,iVar5,local_40->module,(lys_tpdf *)(local_40[1].ref + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x80;
        } while (uVar18 < *(ushort *)(local_40->padding + 2));
      }
      plVar11 = local_40;
      for (plVar13 = local_40->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar13,0x800);
          plVar11 = local_40;
        }
      }
      for (plVar13 = plVar11->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar13,0x903f);
          plVar11 = local_40;
        }
      }
      for (plVar13 = plVar11->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar13,0x4000);
          plVar11 = local_40;
        }
      }
      iVar7 = local_34[0];
      for (plVar13 = plVar11->child; local_34[0] = iVar7, plVar13 != (lys_node *)0x0;
          plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (iVar7 == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar13,0x80);
          plVar11 = local_40;
        }
        iVar7 = local_34[0];
      }
      break;
    case LYS_CHOICE:
      local_34[0] = 0;
      ly_print(out,"%*schoice %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar5 = level + 1;
      _uStack_48 = uVar18;
      yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,1);
      lVar3._0_1_ = local_40->hash[0];
      lVar3._1_1_ = local_40->hash[1];
      lVar3._2_1_ = local_40->hash[2];
      lVar3._3_1_ = local_40->hash[3];
      lVar3._4_4_ = *(undefined4 *)&local_40->field_0x6c;
      if (lVar3 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_when(out,iVar5,local_40->module,*(lys_when **)local_40->hash);
      }
      if (local_40->iffeature_size != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_iffeature
                    (out,iVar5,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x20;
        } while (uVar18 < local_40->iffeature_size);
      }
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)local_40[1].name,
                           local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,0x7c);
      plVar11 = local_40;
      iVar7 = local_34[0];
      for (plVar13 = local_40->child; local_34[0] = iVar7, plVar13 != (lys_node *)0x0;
          plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (iVar7 == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar13,0x807f);
          plVar11 = local_40;
        }
        iVar7 = local_34[0];
      }
      break;
    default:
      goto switchD_00188179_caseD_3;
    case LYS_LEAF:
      uVar16 = level * 2;
      ly_print(out,"%*sleaf %s {\n",(ulong)uVar16);
      iVar5 = level + 1;
      if (local_40->ext_size != 0) {
        yang_print_extension_instances
                  (out,iVar5,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
        yang_print_when(out,iVar5,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          yang_print_iffeature
                    (out,iVar5,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x20;
        } while (uVar18 < local_40->iffeature_size);
      }
      yang_print_type(out,iVar5,local_40->module,(lys_type *)&local_40[1].ref);
      yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_UNITS,'\0',(char *)local_40[1].next,
                         local_40->module,local_40->ext,(uint)local_40->ext_size);
      if (local_40->padding[3] != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          yang_print_must(out,iVar5,local_40->module,(lys_restr *)(local_40[1].dsc + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x38;
        } while (uVar18 < local_40->padding[3]);
      }
      plVar13 = local_40[1].prev;
      if (plVar13 != (lys_node *)0x0) {
        if ((local_40->flags & 0x1000) != 0) {
          _uStack_48 = CONCAT44(flag_1,uVar16);
          pcVar15 = strchr((char *)plVar13,0x3a);
          plVar11 = local_40;
          if (pcVar15 == (char *)0x0) {
            __assert_fail("strchr(leaf->dflt, \':\')",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yang.c"
                          ,0x470,
                          "void yang_print_leaf(struct lyout *, int, const struct lys_node *)");
          }
          plVar8 = lys_node_module(local_40);
          pcVar15 = plVar8->name;
          __s_00 = plVar11[1].prev;
          pcVar10 = strchr((char *)__s_00,0x3a);
          iVar7 = strncmp((char *)plVar13,pcVar15,(long)pcVar10 - (long)__s_00);
          plVar8 = plVar11->module;
          if (iVar7 == 0) {
            plVar13 = (lys_node *)lydict_insert(plVar8->ctx,pcVar10 + 1,0);
          }
          else {
            plVar13 = (lys_node *)transform_json2schema(plVar8,(char *)__s_00);
          }
          uVar16 = uStack_48;
        }
        yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar13,local_40->module,
                           local_40->ext,(uint)local_40->ext_size);
        if ((local_40->flags & 0x1000) != 0) {
          lydict_remove(local_40->module->ctx,(char *)plVar13);
        }
      }
      yang_print_snode_common(out,iVar5,local_40,local_40->module,(int *)0x0,0x7c);
      uVar18 = (ulong)uVar16;
      goto LAB_0018a1e8;
    case LYS_LEAFLIST:
      ly_print(out,"%*sleaf-list %s {\n");
      uVar16 = level + 1;
      if (local_40->ext_size != 0) {
        yang_print_extension_instances
                  (out,uVar16,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
        yang_print_when(out,uVar16,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          yang_print_iffeature
                    (out,uVar16,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x20;
        } while (uVar18 < local_40->iffeature_size);
      }
      yang_print_type(out,uVar16,local_40->module,(lys_type *)&local_40[1].ref);
      yang_print_substmt(out,uVar16,LYEXT_SUBSTMT_UNITS,'\0',(char *)local_40[1].next,
                         local_40->module,local_40->ext,(uint)local_40->ext_size);
      if (local_40->padding[3] != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          yang_print_must(out,uVar16,local_40->module,(lys_restr *)(local_40[1].dsc + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x38;
        } while (uVar18 < local_40->padding[3]);
      }
      _uStack_48 = (ulong)uVar16;
      if (local_40->padding[2] != '\0') {
        uVar18 = 0;
        do {
          plVar13 = local_40;
          if ((local_40->flags & 0x1000) == 0) {
            pcVar15 = *(char **)((local_40[1].prev)->padding + uVar18 * 8 + -0x1c);
          }
          else {
            pcVar15 = *(char **)((local_40[1].prev)->padding + uVar18 * 8 + -0x1c);
            pcVar10 = strchr(pcVar15,0x3a);
            if (pcVar10 == (char *)0x0) {
              __assert_fail("strchr(llist->dflt[i], \':\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yang.c"
                            ,0x4bf,
                            "void yang_print_leaflist(struct lyout *, int, const struct lys_node *)"
                           );
            }
            plVar8 = lys_node_module(plVar13);
            pcVar10 = plVar8->name;
            __s = *(char **)((plVar13[1].prev)->padding + uVar18 * 8 + -0x1c);
            pcVar12 = strchr(__s,0x3a);
            iVar5 = strncmp(pcVar15,pcVar10,(long)pcVar12 - (long)__s);
            if (iVar5 == 0) {
              pcVar15 = lydict_insert(plVar13->module->ctx,pcVar12 + 1,0);
            }
            else {
              pcVar15 = transform_json2schema(plVar13->module,__s);
            }
          }
          yang_print_substmt(out,(int)_uStack_48,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar18,pcVar15,
                             local_40->module,local_40->ext,(uint)local_40->ext_size);
          if ((local_40->flags & 0x1000) != 0) {
            lydict_remove(local_40->module->ctx,pcVar15);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < local_40->padding[2]);
      }
      iVar5 = (int)_uStack_48;
      yang_print_snode_common(out,iVar5,local_40,local_40->module,(int *)0x0,4);
      if (*(uint *)&local_40[1].priv != 0) {
        yang_print_unsigned(out,iVar5,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)&local_40[1].priv);
      }
      uVar16 = *(uint *)((long)&local_40[1].priv + 4);
      if (uVar16 != 0) {
        yang_print_unsigned(out,iVar5,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,uVar16);
      }
      plVar13 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar7 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        if (iVar7 != -1) {
          pcVar15 = "system";
          goto LAB_00189e70;
        }
      }
      else {
        pcVar15 = "user";
LAB_00189e70:
        yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar15,plVar13->module,
                           plVar13->ext,(uint)plVar13->ext_size);
      }
      yang_print_snode_common(out,iVar5,plVar13,plVar13->module,(int *)0x0,0x70);
      uVar18 = (ulong)(uint)(level * 2);
LAB_0018a1e8:
      ly_print(out,"%*s}\n",uVar18,"");
      return;
    }
LAB_0018a0d3:
    iVar5 = (int)_uStack_48;
  }
  else {
    if ((int)LVar19 < 0x40) {
      if (LVar19 != LYS_LIST) {
        if (LVar19 != LYS_ANYXML) {
          return;
        }
LAB_00188bb7:
        local_34[0] = 0;
        plVar11 = lys_parent(local_40);
        if (((plVar11 == (lys_node *)0x0) && (iVar5 = strcmp(plVar13->name,"config"), iVar5 == 0))
           && (iVar5 = strcmp(plVar13->module->name,"ietf-netconf"), iVar5 == 0)) {
          return;
        }
        pcVar15 = "anydata";
        if (plVar13->nodetype == LYS_ANYXML) {
          pcVar15 = "anyxml";
        }
        ly_print(out,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar15,plVar13->name);
        iVar5 = level + 1;
        yang_print_snode_common(out,iVar5,plVar13,plVar13->module,local_34,1);
        if (plVar13[1].name != (char *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
            plVar13 = local_40;
          }
          yang_print_when(out,iVar5,plVar13->module,(lys_when *)plVar13[1].name);
          plVar13 = local_40;
        }
        _uStack_48 = uVar18;
        if (plVar13->iffeature_size != '\0') {
          lVar14 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
              plVar13 = local_40;
            }
            yang_print_iffeature
                      (out,iVar5,plVar13->module,
                       (lys_iffeature *)((long)&plVar13->iffeature->expr + lVar14));
            uVar17 = uVar17 + 1;
            lVar14 = lVar14 + 0x20;
            plVar13 = local_40;
          } while (uVar17 < local_40->iffeature_size);
        }
        if (plVar13->padding[3] != '\0') {
          lVar14 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
              plVar13 = local_40;
            }
            yang_print_must(out,iVar5,plVar13->module,(lys_restr *)(plVar13[1].dsc + lVar14));
            uVar18 = uVar18 + 1;
            lVar14 = lVar14 + 0x38;
            plVar13 = local_40;
          } while (uVar18 < local_40->padding[3]);
        }
        yang_print_snode_common(out,iVar5,plVar13,plVar13->module,local_34,0x7c);
        iVar7 = local_34[0];
        goto LAB_0018a0d3;
      }
      local_34[0] = 0;
      ly_print(out,"%*slist %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar5 = level + 1;
      _uStack_48 = uVar18;
      yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,1);
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_when(out,iVar5,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_iffeature
                    (out,iVar5,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x20;
        } while (uVar18 < local_40->iffeature_size);
      }
      if (local_40->padding[0] != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_must(out,iVar5,local_40->module,(lys_restr *)(local_40[1].dsc + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x38;
        } while (uVar18 < local_40->padding[0]);
      }
      if (local_40->padding[2] != '\0') {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_KEY,'\0',(char *)local_40[1].module,
                           local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      if (local_40->padding[3] != '\0') {
        iVar7 = (int)_uStack_48;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_unique(out,iVar5,local_40->module,(lys_unique *)(local_40[1].ext + uVar18 * 2))
          ;
          plVar13 = local_40;
          iVar6 = -1;
          while (iVar6 = lys_ext_iter(plVar13->ext,plVar13->ext_size,(char)iVar6 + '\x01',
                                      LYEXT_SUBSTMT_UNIQUE), iVar6 != -1) {
            if (uVar18 == plVar13->ext[iVar6]->insubstmt_index) {
              ly_print(out," {\n");
              plVar13 = local_40;
              do {
                yang_print_extension_instances
                          (out,iVar7 + 2,plVar13->module,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar18,
                           plVar13->ext + iVar6,1);
                plVar13 = local_40;
                do {
                  iVar6 = lys_ext_iter(plVar13->ext,plVar13->ext_size,(char)iVar6 + '\x01',
                                       LYEXT_SUBSTMT_UNIQUE);
                  if (iVar6 == -1) {
                    ly_print(out,"%*s}\n",iVar5 * 2,"");
                    goto LAB_00189c58;
                  }
                } while (uVar18 != plVar13->ext[iVar6]->insubstmt_index);
              } while( true );
            }
          }
          ly_print(out,";\n");
LAB_00189c58:
          uVar18 = uVar18 + 1;
        } while (uVar18 < local_40->padding[3]);
      }
      yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,4);
      if (*(int *)&local_40[1].iffeature != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_unsigned(out,iVar5,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)&local_40[1].iffeature);
      }
      if (*(int *)((long)&local_40[1].iffeature + 4) != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_unsigned(out,iVar5,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)((long)&local_40[1].iffeature + 4));
      }
      plVar13 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar7 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        if (iVar7 != -1) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          plVar8 = local_40->module;
          bVar1 = local_40->ext_size;
          pcVar15 = "system";
          goto LAB_00189ef7;
        }
      }
      else {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        plVar8 = local_40->module;
        bVar1 = local_40->ext_size;
        pcVar15 = "user";
LAB_00189ef7:
        plVar13 = local_40;
        yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar15,plVar8,local_40->ext,
                           (uint)bVar1);
      }
      yang_print_snode_common(out,iVar5,plVar13,plVar13->module,local_34,0x70);
      if (plVar13->padding[1] != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
            plVar13 = local_40;
          }
          yang_print_typedef(out,iVar5,plVar13->module,(lys_tpdf *)(plVar13[1].ref + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x80;
          plVar13 = local_40;
        } while (uVar18 < local_40->padding[1]);
      }
      for (plVar11 = plVar13->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar11,0x800);
          plVar13 = local_40;
        }
      }
      for (plVar11 = plVar13->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar11,0x903f);
          plVar13 = local_40;
        }
      }
      for (plVar11 = plVar13->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar11,0x4000);
          plVar13 = local_40;
        }
      }
      iVar7 = local_34[0];
      for (plVar11 = plVar13->child; local_34[0] = iVar7, plVar11 != (lys_node *)0x0;
          plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (iVar7 == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar11,0x80);
          plVar13 = local_40;
        }
        iVar7 = local_34[0];
      }
      goto LAB_0018a0d3;
    }
    if (LVar19 != LYS_CASE) {
      if (LVar19 != LYS_NOTIF) {
        return;
      }
      local_34[0] = 0;
      ly_print(out,"%*snotification %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar5 = level + 1;
      _uStack_48 = uVar18;
      yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,3);
      if (local_40->padding[1] != '\0') {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_must(out,iVar5,local_40->module,(lys_restr *)(local_40[1].dsc + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x38;
        } while (uVar18 < local_40->padding[1]);
      }
      yang_print_snode_common(out,iVar5,local_40,local_40->module,local_34,0x70);
      if (*(short *)(local_40->padding + 2) != 0) {
        lVar14 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_typedef(out,iVar5,local_40->module,(lys_tpdf *)(local_40[1].name + lVar14));
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x80;
        } while (uVar18 < *(ushort *)(local_40->padding + 2));
      }
      plVar11 = local_40;
      for (plVar13 = local_40->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar13,0x800);
          plVar11 = local_40;
        }
      }
      iVar7 = local_34[0];
      for (plVar13 = plVar11->child; local_34[0] = iVar7, plVar13 != (lys_node *)0x0;
          plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (iVar7 == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar13,0x903f);
          plVar11 = local_40;
        }
        iVar7 = local_34[0];
      }
      goto LAB_0018a0d3;
    }
    local_34[0] = 0;
    if ((local_40->flags & 0x40) == 0) {
      ly_print(out,"%*scase %s",(ulong)(uint)(level * 2),"",local_40->name);
      level = level + 1;
      yang_print_snode_common(out,level,local_40,local_40->module,local_34,1);
      lVar4._0_1_ = local_40->hash[0];
      lVar4._1_1_ = local_40->hash[1];
      lVar4._2_1_ = local_40->hash[2];
      lVar4._3_1_ = local_40->hash[3];
      lVar4._4_4_ = *(undefined4 *)&local_40->field_0x6c;
      if (lVar4 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_when(out,level,local_40->module,*(lys_when **)local_40->hash);
      }
      yang_print_snode_common(out,level,local_40,local_40->module,local_34,0x72);
    }
    else {
      local_34[0] = 1;
    }
    plVar11 = local_40;
    iVar7 = local_34[0];
    for (plVar13 = local_40->child; local_34[0] = iVar7, plVar13 != (lys_node *)0x0;
        plVar13 = plVar13->next) {
      if (plVar13->parent == plVar11) {
        if (iVar7 == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_snode(out,level,plVar13,0x903f);
        plVar11 = local_40;
      }
      iVar7 = local_34[0];
    }
    if ((plVar11->flags & 0x40) != 0) {
      return;
    }
    iVar5 = level + -1;
  }
  yang_print_close(out,iVar5,iVar7);
switchD_00188179_caseD_3:
  return;
}

Assistant:

static void
yang_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    if (node->nodetype & mask) {
        if ((node->nodetype & (LYS_INPUT | LYS_OUTPUT)) && (node->flags & LYS_IMPLICIT)) {
            /* implicit input/output node is not supposed to be printed */
            return;
        } else if (!node->parent ||
                (node->parent->nodetype == LYS_AUGMENT && node != node->parent->child) ||
                (node->parent->nodetype != LYS_AUGMENT && node->prev->next)) {
            /* do not print the blank line before the first data-def node */
            ly_print(out, "\n");
        }
    }

    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yang_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yang_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yang_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yang_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yang_print_list(out, level, node);
        break;
    case LYS_USES:
        yang_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yang_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yang_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yang_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yang_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yang_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yang_print_notif(out, level, node);
        break;
    default:
        break;
    }
}